

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

URI * GeneratedSaxParser::Utils::toURI(ParserChar **buffer,bool *failed)

{
  undefined1 *in_RDX;
  undefined8 *in_RSI;
  URI *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  URI *in_stack_00000010;
  ParserString *string;
  ParserChar **in_stack_ffffffffffffffd0;
  
  if (*(char *)*in_RSI == '\0') {
    *in_RDX = 0;
    COLLADABU::URI::URI(in_stack_00000010,in_stack_00000008);
  }
  else {
    toStringListItem(in_stack_ffffffffffffffd0,(bool *)in_RDI);
    COLLADABU::URI::URI(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  return in_RDI;
}

Assistant:

COLLADABU::URI Utils::toURI(const ParserChar** buffer, bool& failed)
    {
        if ( **buffer == '\0' )
        {
            failed = false;
            return COLLADABU::URI(0);
        }
        
        const ParserString& string = toStringListItem(buffer, failed);
        return COLLADABU::URI(string.str, string.length);
        
        //FIXME: Testing fails on windows but pass on OSX with this fix.
        //Just get the string as it is for ids, so that we are able to read FBX-COLLADA
        //Otherwise, calling toStringItem would result in a truncated string when an id contains spaces
        //return COLLADABU::URI((const char*)*buffer);
    }